

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O2

void duckdb::DatePartFunction<duckdb::interval_t>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  ValidityMask *this;
  VectorType VVar1;
  VectorType VVar2;
  unsigned_long *puVar3;
  long *plVar4;
  data_ptr_t pdVar5;
  reference vector;
  reference vector_00;
  long lVar6;
  idx_t iVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  idx_t iVar11;
  idx_t i;
  idx_t iVar12;
  ulong uVar13;
  data_ptr_t pdVar14;
  ulong uVar15;
  ulong uVar16;
  data_ptr_t pdVar17;
  ulong uVar18;
  ulong uVar19;
  idx_t i_1;
  data_ptr_t pdVar20;
  bool bVar21;
  idx_t local_f0;
  UnifiedVectorFormat local_c0;
  UnifiedVectorFormat ldata;
  
  vector = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
  vector_00 = vector<duckdb::Vector,_true>::get<true>(&args->data,1);
  VVar1 = vector->vector_type;
  VVar2 = vector_00->vector_type;
  if ((VVar1 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    plVar4 = (long *)result->data;
    if (((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) &&
       ((puVar3 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
        puVar3 == (unsigned_long *)0x0 || ((*puVar3 & 1) != 0)))) {
      lVar6 = BinaryLambdaWrapperWithNulls::
              Operation<duckdb::DatePartFunction<duckdb::interval_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::interval_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::interval_t,long>
                        (*(undefined8 *)vector->data,*(undefined8 *)(vector->data + 8),
                         *(undefined8 *)vector_00->data,*(undefined8 *)(vector_00->data + 8));
      *plVar4 = lVar6;
      return;
    }
  }
  else {
    local_f0 = args->count;
    if ((VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar1 == FLAT_VECTOR) {
      pdVar17 = vector->data;
      pdVar14 = vector_00->data;
      puVar3 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar5 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector);
        TemplatedValidityMask<unsigned_long>::Copy
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>,
                   &(vector->validity).super_TemplatedValidityMask<unsigned_long>,local_f0);
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          pdVar17 = pdVar17 + 8;
          for (iVar12 = 0; local_f0 != iVar12; iVar12 = iVar12 + 1) {
            lVar6 = BinaryLambdaWrapperWithNulls::
                    Operation<duckdb::DatePartFunction<duckdb::interval_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::interval_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::interval_t,long>
                              (*(undefined8 *)(pdVar17 + -8),*(undefined8 *)pdVar17,
                               *(undefined8 *)pdVar14,*(undefined8 *)(pdVar14 + 8));
            *(long *)(pdVar5 + iVar12 * 8) = lVar6;
            pdVar17 = pdVar17 + 0x10;
          }
          return;
        }
        uVar10 = 0;
        uVar16 = 0;
        do {
          if (uVar10 == local_f0 + 0x3f >> 6) {
            return;
          }
          puVar3 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar3 == (unsigned_long *)0x0) {
            uVar13 = uVar16 + 0x40;
            if (local_f0 <= uVar16 + 0x40) {
              uVar13 = local_f0;
            }
LAB_00c55aa3:
            pdVar20 = pdVar17 + uVar16 * 0x10 + 8;
            for (; uVar8 = uVar16, uVar16 < uVar13; uVar16 = uVar16 + 1) {
              lVar6 = BinaryLambdaWrapperWithNulls::
                      Operation<duckdb::DatePartFunction<duckdb::interval_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::interval_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::interval_t,long>
                                (*(undefined8 *)(pdVar20 + -8),*(undefined8 *)pdVar20,
                                 *(undefined8 *)pdVar14,*(undefined8 *)(pdVar14 + 8));
              *(long *)(pdVar5 + uVar16 * 8) = lVar6;
              pdVar20 = pdVar20 + 0x10;
            }
          }
          else {
            uVar18 = puVar3[uVar10];
            uVar13 = uVar16 + 0x40;
            if (local_f0 <= uVar16 + 0x40) {
              uVar13 = local_f0;
            }
            if (uVar18 == 0xffffffffffffffff) goto LAB_00c55aa3;
            uVar8 = uVar13;
            if (uVar18 != 0) {
              pdVar20 = pdVar17 + uVar16 * 0x10 + 8;
              for (uVar15 = 0; uVar8 = uVar15 + uVar16, uVar15 + uVar16 < uVar13;
                  uVar15 = uVar15 + 1) {
                if ((uVar18 >> (uVar15 & 0x3f) & 1) != 0) {
                  lVar6 = BinaryLambdaWrapperWithNulls::
                          Operation<duckdb::DatePartFunction<duckdb::interval_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::interval_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::interval_t,long>
                                    (*(undefined8 *)(pdVar20 + -8),*(undefined8 *)pdVar20,
                                     *(undefined8 *)pdVar14,*(undefined8 *)(pdVar14 + 8));
                  *(long *)(pdVar5 + uVar15 * 8 + uVar16 * 8) = lVar6;
                }
                pdVar20 = pdVar20 + 0x10;
              }
            }
          }
          uVar10 = uVar10 + 1;
          uVar16 = uVar8;
        } while( true );
      }
    }
    else {
      if ((VVar1 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar2 != FLAT_VECTOR) {
        if (VVar2 == FLAT_VECTOR && VVar1 == FLAT_VECTOR) {
          pdVar17 = vector->data;
          pdVar14 = vector_00->data;
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar5 = result->data;
          FlatVector::VerifyFlatVector(result);
          this = &result->validity;
          FlatVector::VerifyFlatVector(vector);
          TemplatedValidityMask<unsigned_long>::Copy
                    (&this->super_TemplatedValidityMask<unsigned_long>,
                     &(vector->validity).super_TemplatedValidityMask<unsigned_long>,local_f0);
          puVar3 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          FlatVector::VerifyFlatVector(vector_00);
          if (puVar3 == (unsigned_long *)0x0) {
            TemplatedValidityMask<unsigned_long>::Copy
                      (&this->super_TemplatedValidityMask<unsigned_long>,
                       &(vector_00->validity).super_TemplatedValidityMask<unsigned_long>,local_f0);
          }
          else {
            ValidityMask::Combine(this,&vector_00->validity,local_f0);
          }
          if ((this->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
              (unsigned_long *)0x0) {
            lVar6 = 0;
            while (bVar21 = local_f0 != 0, local_f0 = local_f0 - 1, bVar21) {
              lVar9 = BinaryLambdaWrapperWithNulls::
                      Operation<duckdb::DatePartFunction<duckdb::interval_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::interval_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::interval_t,long>
                                (*(undefined8 *)(pdVar17 + lVar6 * 2),
                                 *(undefined8 *)(pdVar17 + lVar6 * 2 + 8),
                                 *(undefined8 *)(pdVar14 + lVar6 * 2),
                                 *(undefined8 *)(pdVar14 + lVar6 * 2 + 8));
              *(long *)(pdVar5 + lVar6) = lVar9;
              lVar6 = lVar6 + 8;
            }
          }
          else {
            uVar16 = 0;
            for (uVar10 = 0; uVar10 != local_f0 + 0x3f >> 6; uVar10 = uVar10 + 1) {
              puVar3 = (this->super_TemplatedValidityMask<unsigned_long>).validity_mask;
              if (puVar3 == (unsigned_long *)0x0) {
                uVar13 = uVar16 + 0x40;
                if (local_f0 <= uVar16 + 0x40) {
                  uVar13 = local_f0;
                }
LAB_00c56028:
                uVar18 = uVar16 << 4 | 8;
                for (; uVar8 = uVar16, uVar16 < uVar13; uVar16 = uVar16 + 1) {
                  lVar6 = BinaryLambdaWrapperWithNulls::
                          Operation<duckdb::DatePartFunction<duckdb::interval_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::interval_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::interval_t,long>
                                    (*(undefined8 *)(pdVar17 + (uVar18 - 8)),
                                     *(undefined8 *)(pdVar17 + uVar18),
                                     *(undefined8 *)(pdVar14 + (uVar18 - 8)),
                                     *(undefined8 *)(pdVar14 + uVar18));
                  *(long *)(pdVar5 + uVar16 * 8) = lVar6;
                  uVar18 = uVar18 + 0x10;
                }
              }
              else {
                uVar18 = puVar3[uVar10];
                uVar13 = uVar16 + 0x40;
                if (local_f0 <= uVar16 + 0x40) {
                  uVar13 = local_f0;
                }
                if (uVar18 == 0xffffffffffffffff) goto LAB_00c56028;
                uVar8 = uVar13;
                if (uVar18 != 0) {
                  uVar19 = uVar16 << 4 | 8;
                  for (uVar15 = 0; uVar8 = uVar16 + uVar15, uVar16 + uVar15 < uVar13;
                      uVar15 = uVar15 + 1) {
                    if ((uVar18 >> (uVar15 & 0x3f) & 1) != 0) {
                      lVar6 = BinaryLambdaWrapperWithNulls::
                              Operation<duckdb::DatePartFunction<duckdb::interval_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::interval_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::interval_t,long>
                                        (*(undefined8 *)(pdVar17 + (uVar19 - 8)),
                                         *(undefined8 *)(pdVar17 + uVar19),
                                         *(undefined8 *)(pdVar14 + (uVar19 - 8)),
                                         *(undefined8 *)(pdVar14 + uVar19));
                      *(long *)(pdVar5 + uVar15 * 8 + uVar16 * 8) = lVar6;
                    }
                    uVar19 = uVar19 + 0x10;
                  }
                }
              }
              uVar16 = uVar8;
            }
          }
        }
        else {
          UnifiedVectorFormat::UnifiedVectorFormat(&ldata);
          UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
          Vector::ToUnifiedFormat(vector,local_f0,&ldata);
          Vector::ToUnifiedFormat(vector_00,local_f0,&local_c0);
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar17 = result->data;
          FlatVector::VerifyFlatVector(result);
          if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0 &&
              ldata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            for (iVar12 = 0; local_f0 != iVar12; iVar12 = iVar12 + 1) {
              iVar7 = iVar12;
              if ((ldata.sel)->sel_vector != (sel_t *)0x0) {
                iVar7 = (idx_t)(ldata.sel)->sel_vector[iVar12];
              }
              iVar11 = iVar12;
              if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
                iVar11 = (idx_t)(local_c0.sel)->sel_vector[iVar12];
              }
              lVar6 = BinaryLambdaWrapperWithNulls::
                      Operation<duckdb::DatePartFunction<duckdb::interval_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::interval_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::interval_t,long>
                                (*(undefined8 *)(ldata.data + iVar7 * 0x10),
                                 *(undefined8 *)(ldata.data + iVar7 * 0x10 + 8),
                                 *(undefined8 *)(local_c0.data + iVar11 * 0x10),
                                 *(undefined8 *)(local_c0.data + iVar11 * 0x10 + 8));
              *(long *)(pdVar17 + iVar12 * 8) = lVar6;
            }
          }
          else {
            for (iVar12 = 0; local_f0 != iVar12; iVar12 = iVar12 + 1) {
              iVar7 = iVar12;
              if ((ldata.sel)->sel_vector != (sel_t *)0x0) {
                iVar7 = (idx_t)(ldata.sel)->sel_vector[iVar12];
              }
              iVar11 = iVar12;
              if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
                iVar11 = (idx_t)(local_c0.sel)->sel_vector[iVar12];
              }
              if (((ldata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                    (unsigned_long *)0x0) ||
                  ((ldata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar7 >> 6] >> (iVar7 & 0x3f) & 1) != 0)) &&
                 ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                   (unsigned_long *)0x0 ||
                  ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar11 >> 6] >> (iVar11 & 0x3f) & 1) != 0)))) {
                lVar6 = BinaryLambdaWrapperWithNulls::
                        Operation<duckdb::DatePartFunction<duckdb::interval_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::interval_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::interval_t,long>
                                  (*(undefined8 *)(ldata.data + iVar7 * 0x10),
                                   *(undefined8 *)(ldata.data + iVar7 * 0x10 + 8),
                                   *(undefined8 *)(local_c0.data + iVar11 * 0x10),
                                   *(undefined8 *)(local_c0.data + iVar11 * 0x10 + 8));
                *(long *)(pdVar17 + iVar12 * 8) = lVar6;
              }
              else {
                TemplatedValidityMask<unsigned_long>::SetInvalid
                          (&(result->validity).super_TemplatedValidityMask<unsigned_long>,iVar12);
              }
            }
          }
          UnifiedVectorFormat::~UnifiedVectorFormat(&local_c0);
          UnifiedVectorFormat::~UnifiedVectorFormat(&ldata);
        }
        return;
      }
      pdVar17 = vector->data;
      puVar3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      pdVar14 = vector_00->data;
      if ((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar5 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector_00);
        TemplatedValidityMask<unsigned_long>::Copy
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>,
                   &(vector_00->validity).super_TemplatedValidityMask<unsigned_long>,local_f0);
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          pdVar14 = pdVar14 + 8;
          for (iVar12 = 0; local_f0 != iVar12; iVar12 = iVar12 + 1) {
            lVar6 = BinaryLambdaWrapperWithNulls::
                    Operation<duckdb::DatePartFunction<duckdb::interval_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::interval_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::interval_t,long>
                              (*(undefined8 *)pdVar17,*(undefined8 *)(pdVar17 + 8),
                               *(undefined8 *)(pdVar14 + -8),*(undefined8 *)pdVar14);
            *(long *)(pdVar5 + iVar12 * 8) = lVar6;
            pdVar14 = pdVar14 + 0x10;
          }
          return;
        }
        uVar10 = 0;
        uVar16 = 0;
        do {
          if (uVar10 == local_f0 + 0x3f >> 6) {
            return;
          }
          puVar3 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar3 == (unsigned_long *)0x0) {
            uVar13 = uVar16 + 0x40;
            if (local_f0 <= uVar16 + 0x40) {
              uVar13 = local_f0;
            }
LAB_00c55d33:
            pdVar20 = pdVar14 + uVar16 * 0x10 + 8;
            for (; uVar8 = uVar16, uVar16 < uVar13; uVar16 = uVar16 + 1) {
              lVar6 = BinaryLambdaWrapperWithNulls::
                      Operation<duckdb::DatePartFunction<duckdb::interval_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::interval_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::interval_t,long>
                                (*(undefined8 *)pdVar17,*(undefined8 *)(pdVar17 + 8),
                                 *(undefined8 *)(pdVar20 + -8),*(undefined8 *)pdVar20);
              *(long *)(pdVar5 + uVar16 * 8) = lVar6;
              pdVar20 = pdVar20 + 0x10;
            }
          }
          else {
            uVar18 = puVar3[uVar10];
            uVar13 = uVar16 + 0x40;
            if (local_f0 <= uVar16 + 0x40) {
              uVar13 = local_f0;
            }
            if (uVar18 == 0xffffffffffffffff) goto LAB_00c55d33;
            uVar8 = uVar13;
            if (uVar18 != 0) {
              pdVar20 = pdVar14 + uVar16 * 0x10 + 8;
              for (uVar15 = 0; uVar8 = uVar16 + uVar15, uVar16 + uVar15 < uVar13;
                  uVar15 = uVar15 + 1) {
                if ((uVar18 >> (uVar15 & 0x3f) & 1) != 0) {
                  lVar6 = BinaryLambdaWrapperWithNulls::
                          Operation<duckdb::DatePartFunction<duckdb::interval_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::interval_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::interval_t,long>
                                    (*(undefined8 *)pdVar17,*(undefined8 *)(pdVar17 + 8),
                                     *(undefined8 *)(pdVar20 + -8),*(undefined8 *)pdVar20);
                  *(long *)(pdVar5 + uVar15 * 8 + uVar16 * 8) = lVar6;
                }
                pdVar20 = pdVar20 + 0x10;
              }
            }
          }
          uVar10 = uVar10 + 1;
          uVar16 = uVar8;
        } while( true );
      }
    }
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void DatePartFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 2);
	auto &spec_arg = args.data[0];
	auto &date_arg = args.data[1];

	BinaryExecutor::ExecuteWithNulls<string_t, T, int64_t>(
	    spec_arg, date_arg, result, args.size(), [&](string_t specifier, T date, ValidityMask &mask, idx_t idx) {
		    if (Value::IsFinite(date)) {
			    return ExtractElement<T>(GetDatePartSpecifier(specifier.GetString()), date);
		    } else {
			    mask.SetInvalid(idx);
			    return int64_t(0);
		    }
	    });
}